

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_BasicCommands.c
# Opt level: O1

void test_CmdGetDaqProcessorInfo(void)

{
  XcpLight_self.session_status = XcpLight_self.session_status | 2;
  XcpLight_self.protection_status = '\0';
  cmdMsg.length = 1;
  cmdMsg.payload[0] = 0xda;
  XcpLight_processCommand(&cmdMsg);
  UnityAssertEqualNumber(8,(ulong)(byte)reply_msg.length,(char *)0x0,0x87,UNITY_DISPLAY_STYLE_UINT8)
  ;
  UnityAssertEqualNumber
            (0xff,(ulong)reply_msg.payload[0],(char *)0x0,0x88,UNITY_DISPLAY_STYLE_UINT8);
  return;
}

Assistant:

void test_CmdGetDaqProcessorInfo(void)
{
  SET_SESSION_CONNECTED();
  SET_UNLOCK_ALL_RESOURCES();
  cmdMsg.length = 1u;
  cmdMsg.payload[0] = XCP_CMD_GET_DAQ_PROCESSOR_INFO;

  XcpLight_processCommand(&cmdMsg);

  TEST_ASSERT_EQUAL_UINT8(  8u, reply_msg.length);
  TEST_ASSERT_EQUAL_UINT8(0xFF, reply_msg.payload[0]); // Ok:GET_DAQ_PROCESSOR_INFO
}